

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

bool duckdb::Optimizer::OptimizerDisabled(ClientContext *context_p,OptimizerType type)

{
  DBConfig *pDVar1;
  iterator iVar2;
  key_type local_14;
  
  pDVar1 = DBConfig::GetConfig(context_p);
  iVar2 = ::std::
          _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
          ::find(&(pDVar1->options).disabled_optimizers._M_t,&local_14);
  return (_Rb_tree_header *)iVar2._M_node !=
         &(pDVar1->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool Optimizer::OptimizerDisabled(ClientContext &context_p, OptimizerType type) {
	auto &config = DBConfig::GetConfig(context_p);
	return config.options.disabled_optimizers.find(type) != config.options.disabled_optimizers.end();
}